

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__compute_transparency16(stbi__png *z,stbi__uint16 *tc,int out_n)

{
  stbi__uint16 sVar1;
  uint uVar2;
  stbi__uint16 *local_38;
  stbi__uint16 *p;
  stbi__uint32 pixel_count;
  stbi__uint32 i;
  stbi__context *s;
  int out_n_local;
  stbi__uint16 *tc_local;
  stbi__png *z_local;
  
  uVar2 = z->s->img_x * z->s->img_y;
  local_38 = (stbi__uint16 *)z->out;
  if (out_n != 2 && out_n != 4) {
    __assert_fail("out_n == 2 || out_n == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/src/../include/stb_image.h"
                  ,0x12dc,"int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)");
  }
  if (out_n == 2) {
    for (p._4_4_ = 0; p._4_4_ < uVar2; p._4_4_ = p._4_4_ + 1) {
      sVar1 = 0xffff;
      if (*local_38 == *tc) {
        sVar1 = 0;
      }
      local_38[1] = sVar1;
      local_38 = local_38 + 2;
    }
  }
  else {
    for (p._4_4_ = 0; p._4_4_ < uVar2; p._4_4_ = p._4_4_ + 1) {
      if (((*local_38 == *tc) && (local_38[1] == tc[1])) && (local_38[2] == tc[2])) {
        local_38[3] = 0;
      }
      local_38 = local_38 + 4;
    }
  }
  return 1;
}

Assistant:

static int stbi__compute_transparency16(stbi__png *z, stbi__uint16 tc[3], int out_n)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi__uint16 *p = (stbi__uint16*) z->out;

   // compute color-based transparency, assuming we've
   // already got 65535 as the alpha value in the output
   STBI_ASSERT(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i = 0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 65535);
         p += 2;
      }
   } else {
      for (i = 0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}